

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 02_position_offline.cpp
# Opt level: O3

int main(void)

{
  Result RVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  size_t new_section;
  array<double,_3UL> new_position;
  Trajectory<3UL,_ruckig::StandardVector> trajectory;
  array<double,_3UL> new_acceleration;
  array<double,_3UL> new_velocity;
  array<ruckig::Bound,_3UL> position_extrema;
  InputParameter<3UL,_ruckig::StandardVector> input;
  Ruckig<3UL,_ruckig::StandardVector,_false> otg;
  long *local_1ea8;
  long local_1ea0;
  long local_1e98 [2];
  Vector<double> local_1e88;
  Trajectory<3UL,_ruckig::StandardVector> local_1e70;
  Vector<double> local_1db0;
  Vector<double> local_1d98;
  Vector<Bound> local_1d80;
  ios_base local_1d10 [264];
  InputParameter<3UL,_ruckig::StandardVector> local_1c08;
  undefined1 local_1938 [6416];
  
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::InputParameter<3UL,_0>(&local_1c08);
  local_1c08.current_position._M_elems[2] = 0.5;
  local_1c08.current_position._M_elems[0] = 0.0;
  local_1c08.current_position._M_elems[1] = 0.0;
  local_1c08.current_velocity._M_elems[2] = -0.5;
  local_1c08.current_velocity._M_elems[0] = 0.0;
  local_1c08.current_velocity._M_elems[1] = -2.2;
  local_1c08.current_acceleration._M_elems[2] = -0.5;
  local_1c08.current_acceleration._M_elems[0] = 0.0;
  local_1c08.current_acceleration._M_elems[1] = 2.5;
  local_1c08.target_position._M_elems[2] = -3.5;
  local_1c08.target_position._M_elems[0] = 5.0;
  local_1c08.target_position._M_elems[1] = -2.0;
  local_1c08.target_velocity._M_elems[2] = -2.0;
  local_1c08.target_velocity._M_elems[0] = 0.0;
  local_1c08.target_velocity._M_elems[1] = -0.5;
  local_1c08.target_acceleration._M_elems[2] = 0.5;
  local_1c08.target_acceleration._M_elems[0] = 0.0;
  local_1c08.target_acceleration._M_elems[1] = 0.0;
  local_1c08.max_velocity._M_elems[2] = 3.0;
  local_1c08.max_velocity._M_elems[0] = 3.0;
  local_1c08.max_velocity._M_elems[1] = 1.0;
  local_1c08.max_acceleration._M_elems[2] = 1.0;
  local_1c08.max_acceleration._M_elems[0] = 3.0;
  local_1c08.max_acceleration._M_elems[1] = 2.0;
  local_1c08.max_jerk._M_elems[2] = 2.0;
  local_1c08.max_jerk._M_elems[0] = 4.0;
  local_1c08.max_jerk._M_elems[1] = 3.0;
  local_1c08.min_velocity.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[2] = -3.0;
  local_1c08.min_velocity.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[0] = -2.0;
  local_1c08.min_velocity.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[1] = -0.5;
  if (local_1c08.min_velocity.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
      super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == false) {
    local_1c08.min_velocity.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
    super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged = true;
  }
  local_1c08.min_acceleration.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[0] = -2.0;
  local_1c08.min_acceleration.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[1] = -2.0;
  local_1c08.min_acceleration.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
  super__Optional_payload_base<std::array<double,_3UL>_>._M_payload._M_value._M_elems[2] = -2.0;
  if (local_1c08.min_acceleration.super__Optional_base<std::array<double,_3UL>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == false) {
    local_1c08.min_acceleration.super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload
    .super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged = true;
  }
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::Ruckig<3UL,_0>
            ((Ruckig<3UL,_ruckig::StandardVector,_false> *)local_1938);
  ruckig::Trajectory<3UL,_ruckig::StandardVector>::Trajectory<3UL,_0>(&local_1e70);
  local_1d80._M_elems[0].min = (double)((ulong)local_1d80._M_elems[0].min & 0xffffffffffffff00);
  RVar1 = ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::calculate
                    ((Ruckig<3UL,_ruckig::StandardVector,_false> *)local_1938,&local_1c08,
                     &local_1e70,(bool *)&local_1d80);
  if (RVar1 == ErrorInvalidInput) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Invalid input!",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    iVar3 = -1;
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Trajectory duration: ",0x15);
    poVar2 = std::ostream::_M_insert<double>(local_1e70.duration);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," [s].",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    local_1d80._M_elems[0].min = (double)&local_1e88;
    local_1d80._M_elems[0].max = (double)&local_1d98;
    local_1d80._M_elems[0].t_min = (double)&local_1db0;
    ruckig::Trajectory<3ul,ruckig::StandardVector>::
    state_to_integrate_from<ruckig::Trajectory<3ul,ruckig::StandardVector>::at_time(double,std::array<double,3ul>&,std::array<double,3ul>&,std::array<double,3ul>&)const::_lambda(unsigned_long,double,double,double,double,double)_1_>
              ((Trajectory<3ul,ruckig::StandardVector> *)&local_1e70,1.0,(size_t *)&local_1ea8,
               (anon_class_24_3_cb1bcd32 *)&local_1d80);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Position at time ",0x11);
    poVar2 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," [s]: ",6);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d80);
    lVar4 = 0;
    do {
      if (lVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1d80,", ",2);
      }
      std::ostream::_M_insert<double>(local_1e88._M_elems[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d80);
    std::ios_base::~ios_base(local_1d10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)local_1ea8,local_1ea0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_1ea8 != local_1e98) {
      operator_delete(local_1ea8,local_1e98[0] + 1);
    }
    ruckig::Trajectory<3UL,_ruckig::StandardVector>::get_position_extrema(&local_1d80,&local_1e70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Position extremas for DoF 4 are ",0x20);
    poVar2 = std::ostream::_M_insert<double>(local_1d80._M_elems[2].min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (min) to ",10);
    poVar2 = std::ostream::_M_insert<double>(local_1d80._M_elems[2].max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (max)",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    iVar3 = 0;
  }
  if (local_1e70.cumulative_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e70.cumulative_times.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e70.cumulative_times.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e70.cumulative_times.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e70.profiles.
      super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e70.profiles.
                    super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e70.profiles.
                          super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e70.profiles.
                          super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1938._6376_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1938._6376_8_);
  }
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter
            ((InputParameter<3UL,_ruckig::StandardVector> *)local_1938);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter(&local_1c08);
  return iVar3;
}

Assistant:

int main() {
    // Create input parameters
    InputParameter<3> input;
    input.current_position = {0.0, 0.0, 0.5};
    input.current_velocity = {0.0, -2.2, -0.5};
    input.current_acceleration = {0.0, 2.5, -0.5};

    input.target_position = {5.0, -2.0, -3.5};
    input.target_velocity = {0.0, -0.5, -2.0};
    input.target_acceleration = {0.0, 0.0, 0.5};

    input.max_velocity = {3.0, 1.0, 3.0};
    input.max_acceleration = {3.0, 2.0, 1.0};
    input.max_jerk = {4.0, 3.0, 2.0};

    // Set different constraints for negative direction
    input.min_velocity = {-2.0, -0.5, -3.0};
    input.min_acceleration = {-2.0, -2.0, -2.0};

    // We don't need to pass the control rate (cycle time) when using only offline features
    Ruckig<3> otg;
    Trajectory<3> trajectory;

    // Calculate the trajectory in an offline manner (outside of the control loop)
    Result result = otg.calculate(input, trajectory);
    if (result == Result::ErrorInvalidInput) {
        std::cout << "Invalid input!" << std::endl;
        return -1;
    }

    // Get duration of the trajectory
    std::cout << "Trajectory duration: " << trajectory.get_duration() << " [s]." << std::endl;

    double new_time = 1.0;

    // Then, we can calculate the kinematic state at a given time
    std::array<double, 3> new_position, new_velocity, new_acceleration;
    trajectory.at_time(new_time, new_position, new_velocity, new_acceleration);

    std::cout << "Position at time " << new_time << " [s]: " << join(new_position) << std::endl;

    // Get some info about the position extrema of the trajectory
    std::array<Bound, 3> position_extrema = trajectory.get_position_extrema();
    std::cout << "Position extremas for DoF 4 are " << position_extrema[2].min << " (min) to " << position_extrema[2].max << " (max)" << std::endl;
}